

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O2

void P_RecalculateLights(sector_t *sector)

{
  extsector_t *peVar1;
  lightlist_t *plVar2;
  F3DFloor *this;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 aVar3;
  uint i;
  ulong uVar4;
  long lVar5;
  
  peVar1 = sector->e;
  lVar5 = 0x30;
  for (uVar4 = 0; uVar4 < (peVar1->XFloor).lightlist.Count; uVar4 = uVar4 + 1) {
    plVar2 = (peVar1->XFloor).lightlist.Array;
    this = *(F3DFloor **)((long)&(plVar2->plane).normal.Z + lVar5);
    if (this == (F3DFloor *)0x0) {
      *(FDynamicColormap **)((long)&(plVar2->plane).normal.X + lVar5) = sector->ColorMap;
      *(undefined4 *)((long)&(plVar2->plane).normal.Y + lVar5) = 0;
    }
    else {
      F3DFloor::UpdateColormap(this,(FDynamicColormap **)((long)&(plVar2->plane).normal.X + lVar5));
      aVar3 = (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
              F3DFloor::GetBlend(*(F3DFloor **)((long)&(plVar2->plane).normal.Z + lVar5));
      ((anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)&(plVar2->plane).normal.Y + lVar5))->field_0
           = aVar3;
    }
    lVar5 = lVar5 + 0x50;
  }
  return;
}

Assistant:

void P_RecalculateLights(sector_t *sector)
{
	TArray<lightlist_t> &lightlist = sector->e->XFloor.lightlist;

	for(unsigned i = 0; i < lightlist.Size(); i++)
	{
		lightlist_t *ll = &lightlist[i];
		if (ll->lightsource != NULL)
		{
			ll->lightsource->UpdateColormap(ll->extra_colormap);
			ll->blend = ll->lightsource->GetBlend();
		}
		else
		{
			ll->extra_colormap = sector->ColorMap;
			ll->blend = 0;
		}
	}
}